

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5.c
# Opt level: O0

char * socks5_auth_name(uchar m)

{
  char *pcStack_10;
  uchar m_local;
  
  switch(m) {
  case '\0':
    pcStack_10 = "none";
    break;
  case '\x01':
    pcStack_10 = "GSSAPI";
    break;
  case '\x02':
    pcStack_10 = "password";
    break;
  case '\x03':
    pcStack_10 = "CHAP";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

static inline const char *socks5_auth_name(unsigned char m)
{
    switch (m) {
      case SOCKS5_AUTH_NONE: return "none";
      case SOCKS5_AUTH_GSSAPI: return "GSSAPI";
      case SOCKS5_AUTH_PASSWORD: return "password";
      case SOCKS5_AUTH_CHAP: return "CHAP";
      default: return "unknown";
    }
}